

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise.cpp
# Opt level: O3

int __thiscall
ncnn::DeconvolutionDepthWise::forward
          (DeconvolutionDepthWise *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  pointer piVar3;
  Allocator *pAVar4;
  void *pvVar5;
  float *pfVar6;
  size_t sVar7;
  void *pvVar8;
  undefined8 uVar9;
  int iVar10;
  int iVar11;
  int *piVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  size_t sVar19;
  ulong uVar20;
  void *pvVar21;
  int iVar22;
  long lVar23;
  pointer piVar24;
  void *pvVar25;
  int iVar26;
  uint uVar27;
  Allocator *pAVar28;
  pointer piVar29;
  pointer piVar30;
  pointer piVar31;
  long lVar32;
  long lVar33;
  void *pvVar34;
  uint uVar35;
  long lVar36;
  int iVar37;
  size_type __n;
  ulong uVar38;
  uint uVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  uint uVar43;
  float fVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  void *local_1e8;
  int size_3;
  undefined1 local_1c8 [32];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  allocator_type local_179;
  pointer local_178;
  Mat *local_170;
  pointer local_168;
  long local_160;
  float *local_158;
  void *local_150;
  pointer local_148;
  ulong local_140;
  ulong local_138;
  pointer local_130;
  int remain;
  pointer local_120;
  ulong local_118;
  pointer local_110;
  ulong local_108;
  ulong local_100;
  void *local_f8;
  pointer local_f0;
  int local_e4;
  int local_e0;
  int local_dc;
  vector<int,_std::allocator<int>_> _space_ofs;
  pointer local_b0;
  pointer local_a8;
  int remain_1;
  
  local_120 = (pointer)(ulong)(uint)bottom_blob->c;
  if (bottom_blob->c % this->group != 0) {
    return -100;
  }
  iVar11 = this->num_output;
  if (iVar11 % this->group != 0) {
    return -100;
  }
  local_160 = (long)bottom_blob->w;
  local_110 = (pointer)(ulong)(uint)bottom_blob->h;
  piVar3 = (pointer)bottom_blob->elemsize;
  iVar10 = (this->kernel_w + -1) * this->dilation_w + (bottom_blob->w + -1) * this->stride_w + 1;
  iVar14 = (this->kernel_h + -1) * this->dilation_h + (bottom_blob->h - 1U) * this->stride_h + 1;
  local_1c8._16_8_ = (pointer)0x0;
  local_1c8._24_4_ = 0;
  local_1c8._0_8_ = (pointer)0x0;
  local_1c8._8_4_ = 0;
  local_1c8._12_4_ = 0;
  local_1a8 = (undefined1  [16])0x0;
  local_198 = (undefined1  [16])0x0;
  local_170 = bottom_blob;
  if ((this->pad_w < 1) && (this->pad_h < 1)) {
    if ((Mat *)local_1c8 == top_blob) {
      sVar19 = 0;
      bVar42 = true;
      piVar12 = (int *)0x0;
      pAVar28 = (Allocator *)0x0;
      bVar41 = false;
      iVar15 = 0;
      iVar18 = 0;
      iVar37 = 0;
      bVar40 = false;
    }
    else {
      piVar12 = top_blob->refcount;
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + 1;
        UNLOCK();
      }
      local_1c8._0_8_ = top_blob->data;
      piVar12 = top_blob->refcount;
      local_1c8._8_4_ = SUB84(piVar12,0);
      local_1c8._12_4_ = (undefined4)((ulong)piVar12 >> 0x20);
      local_1c8._16_8_ = top_blob->elemsize;
      local_1c8._24_4_ = top_blob->packing;
      pAVar28 = top_blob->allocator;
      iVar37 = top_blob->w;
      local_1a8._0_8_ = top_blob->allocator;
      local_1a8._8_4_ = top_blob->dims;
      local_1a8._12_4_ = top_blob->w;
      iVar18 = top_blob->h;
      iVar15 = top_blob->c;
      sVar19 = top_blob->cstep;
      local_198._0_4_ = top_blob->h;
      local_198._4_4_ = top_blob->c;
      local_198._8_8_ = top_blob->cstep;
      iVar11 = this->num_output;
      bVar40 = top_blob->dims == 3;
      bVar41 = local_1c8._24_4_ == 1;
      bVar42 = (pointer)local_1c8._0_8_ == (pointer)0x0;
    }
    pAVar4 = opt->blob_allocator;
    if ((bool)((pointer)local_1c8._16_8_ == piVar3 & bVar41 &
               (iVar15 == iVar11 && iVar18 == iVar14) & iVar37 == iVar10 & bVar40 &
              pAVar28 == pAVar4)) {
      iVar11 = -100;
      if (!bVar42) goto LAB_0015bc14;
    }
    else {
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + -1;
        UNLOCK();
        if (*piVar12 == 0) {
          if ((Allocator *)local_1a8._0_8_ == (Allocator *)0x0) {
            if ((pointer)local_1c8._0_8_ != (pointer)0x0) {
              free((void *)local_1c8._0_8_);
            }
          }
          else {
            (**(code **)(*(long *)local_1a8._0_8_ + 0x18))();
          }
        }
      }
      local_1c8._0_8_ = (void *)0x0;
      local_1c8._8_4_ = 0;
      local_1c8._12_4_ = 0;
      local_1c8._24_4_ = 1;
      local_1a8._8_4_ = 3;
      local_1a8._0_8_ = pAVar4;
      local_1a8._12_4_ = iVar10;
      local_198._4_4_ = iVar11;
      local_198._0_4_ = iVar14;
      local_198._8_8_ =
           ((long)(iVar14 * iVar10) * (long)piVar3 + 0xfU & 0xfffffffffffffff0) / (ulong)piVar3;
      lVar33 = (long)iVar11 * local_198._8_8_;
      if (lVar33 == 0) {
        return -100;
      }
      uVar38 = lVar33 * (long)piVar3 + 3U & 0xfffffffffffffffc;
      if (pAVar4 == (Allocator *)0x0) {
        _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_1c8._16_8_ = piVar3;
        iVar11 = posix_memalign((void **)&_space_ofs,0x10,uVar38 + 4);
        local_1c8._0_8_ = (pointer)0x0;
        if (iVar11 == 0) {
          local_1c8._0_8_ =
               _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
      }
      else {
        local_1c8._16_8_ = piVar3;
        local_1c8._0_8_ = (**(code **)(*(long *)pAVar4 + 0x10))(pAVar4,uVar38 + 4);
      }
      piVar12 = (int *)(uVar38 + local_1c8._0_8_);
      *(undefined4 *)(local_1c8._0_8_ + uVar38) = 1;
      sVar19 = local_198._8_8_;
      iVar15 = local_198._4_4_;
      local_1c8._8_8_ = piVar12;
LAB_0015bc14:
      if ((long)iVar15 * sVar19 != 0) goto LAB_0015bc24;
      iVar11 = -100;
    }
  }
  else {
    local_1a8._0_8_ = opt->workspace_allocator;
    local_1c8._0_8_ = (void *)0x0;
    local_1c8._8_4_ = 0;
    local_1c8._12_4_ = 0;
    local_1c8._24_4_ = 1;
    local_1a8._8_4_ = 3;
    local_1a8._12_4_ = iVar10;
    local_198._4_4_ = iVar11;
    local_198._0_4_ = iVar14;
    local_198._8_8_ =
         ((long)(iVar14 * iVar10) * (long)piVar3 + 0xfU & 0xfffffffffffffff0) / (ulong)piVar3;
    lVar33 = (long)iVar11 * local_198._8_8_;
    if (lVar33 == 0) {
      return -100;
    }
    uVar38 = lVar33 * (long)piVar3 + 3U & 0xfffffffffffffffc;
    if ((Allocator *)local_1a8._0_8_ == (Allocator *)0x0) {
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_1c8._16_8_ = piVar3;
      iVar11 = posix_memalign((void **)&_space_ofs,0x10,uVar38 + 4);
      local_1c8._0_8_ = (pointer)0x0;
      if (iVar11 == 0) {
        local_1c8._0_8_ =
             _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
    }
    else {
      local_1c8._16_8_ = piVar3;
      local_1c8._0_8_ = (**(code **)(*(long *)local_1a8._0_8_ + 0x10))(local_1a8._0_8_,uVar38 + 4);
    }
    piVar12 = (int *)(uVar38 + local_1c8._0_8_);
    *(undefined4 *)(local_1c8._0_8_ + uVar38) = 1;
    local_1c8._8_8_ = piVar12;
    if ((long)(int)local_198._4_4_ * local_198._8_8_ == 0) {
      iVar11 = -100;
      goto LAB_0015c858;
    }
LAB_0015bc24:
    uVar39 = this->kernel_w * this->kernel_h;
    __n = (size_type)(int)uVar39;
    std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,__n,&local_179);
    piVar3 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar9 = local_1c8._0_8_;
    iVar11 = this->kernel_h;
    if (0 < iVar11) {
      iVar37 = this->dilation_h;
      iVar18 = this->kernel_w;
      iVar15 = this->dilation_w * iVar18;
      iVar16 = 0;
      iVar22 = 0;
      iVar26 = 0;
      do {
        if (0 < iVar18) {
          lVar33 = 0;
          do {
            _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[iVar16 + lVar33] = iVar22;
            iVar22 = iVar22 + this->dilation_w;
            iVar18 = this->kernel_w;
            lVar33 = lVar33 + 1;
          } while ((int)lVar33 < iVar18);
          iVar16 = iVar16 + (int)lVar33;
          iVar11 = this->kernel_h;
        }
        iVar22 = iVar22 + (iVar37 * iVar10 - iVar15);
        iVar26 = iVar26 + 1;
      } while (iVar26 < iVar11);
    }
    uVar17 = this->group;
    uVar27 = (uint)local_120;
    if (uVar17 == this->num_output && uVar27 == uVar17) {
      if (0 < (int)uVar27) {
        pvVar5 = local_170->data;
        local_f8 = (void *)(local_170->cstep * local_170->elemsize);
        pvVar25 = (this->weight_data).data;
        local_168 = (pointer)local_1c8._16_8_;
        local_170 = (Mat *)(local_198._8_8_ * local_1c8._16_8_);
        local_140 = CONCAT44(local_140._4_4_,local_1a8._12_4_);
        _remain = (pointer)(ulong)(uint)(local_198._0_4_ * local_1a8._12_4_);
        local_130 = (pointer)CONCAT44(local_130._4_4_,this->bias_term);
        local_150 = (this->bias_data).data;
        uVar17 = iVar14 * iVar10;
        uVar38 = (ulong)uVar17;
        local_158 = (float *)(this->activation_params).data;
        local_138 = (ulong)(local_198._0_4_ * local_1a8._12_4_ + 3 & 0xfffffffc);
        lVar33 = (long)_remain - 1;
        auVar49._8_4_ = (int)lVar33;
        auVar49._0_8_ = lVar33;
        auVar49._12_4_ = (int)((ulong)lVar33 >> 0x20);
        piVar31 = (pointer)(local_1c8._0_8_ + 0xc);
        auVar49 = auVar49 ^ _DAT_00162c50;
        local_118 = (ulong)(this->activation_type - 1);
        piVar24 = (pointer)0x0;
        local_148 = (pointer)local_1c8._0_8_;
        piVar29 = (pointer)local_1c8._0_8_;
        auVar50 = _DAT_00163370;
        auVar51 = _DAT_00163380;
        auVar52 = _DAT_00162c50;
        do {
          iVar11 = 0;
          if ((int)local_130 != 0) {
            iVar11 = *(int *)((long)local_150 + (long)piVar24 * 4);
          }
          if (0 < remain) {
            uVar13 = 0;
            do {
              auVar45._8_4_ = (int)uVar13;
              auVar45._0_8_ = uVar13;
              auVar45._12_4_ = (int)(uVar13 >> 0x20);
              auVar48 = (auVar45 | auVar51) ^ auVar52;
              iVar10 = auVar49._4_4_;
              if ((bool)(~(iVar10 < auVar48._4_4_ ||
                          auVar49._0_4_ < auVar48._0_4_ && auVar48._4_4_ == iVar10) & 1)) {
                piVar31[uVar13 - 3] = iVar11;
              }
              if (auVar48._12_4_ <= auVar49._12_4_ &&
                  (auVar48._8_4_ <= auVar49._8_4_ || auVar48._12_4_ != auVar49._12_4_)) {
                piVar31[uVar13 - 2] = iVar11;
              }
              auVar48 = (auVar45 | auVar50) ^ auVar52;
              iVar14 = auVar48._4_4_;
              if (iVar14 <= iVar10 && (iVar14 != iVar10 || auVar48._0_4_ <= auVar49._0_4_)) {
                piVar31[uVar13 - 1] = iVar11;
                piVar31[uVar13] = iVar11;
              }
              uVar13 = uVar13 + 4;
            } while (local_138 != uVar13);
          }
          if (0 < (int)local_110) {
            iVar11 = this->stride_h;
            iVar10 = this->stride_w;
            piVar30 = (pointer)0x0;
            do {
              if (0 < (int)local_160) {
                lVar33 = 0;
                do {
                  if (0 < (int)uVar39) {
                    lVar36 = lVar33 * iVar10 * 4 +
                             (long)(int)(iVar11 * (uint)local_140 * (int)piVar30) * (long)local_168
                             + (long)local_170 * (long)piVar24;
                    uVar13 = 0;
                    do {
                      lVar23 = (long)piVar3[uVar13];
                      *(float *)((long)local_148 + lVar23 * 4 + lVar36) =
                           *(float *)((long)pvVar25 + uVar13 * 4) *
                           *(float *)((long)pvVar5 +
                                     lVar33 * 4 +
                                     (long)piVar30 * local_160 * 4 + (long)local_f8 * (long)piVar24)
                           + *(float *)((long)local_148 + lVar23 * 4 + lVar36);
                      uVar13 = uVar13 + 1;
                    } while (uVar39 != uVar13);
                  }
                  lVar33 = lVar33 + 1;
                } while (lVar33 != local_160);
              }
              piVar30 = (pointer)((long)piVar30 + 1);
            } while (piVar30 != local_110);
          }
          local_178 = piVar24;
          local_f0 = piVar31;
          if ((uint)local_118 < 4) {
            switch((long)&switchD_0015c003::switchdataD_00163adc +
                   (long)(int)(&switchD_0015c003::switchdataD_00163adc)[local_118]) {
            case 0x15c005:
              if (0 < (int)uVar17) {
                uVar13 = 0;
                do {
                  fVar44 = (float)piVar29[uVar13];
                  if (fVar44 <= 0.0) {
                    fVar44 = 0.0;
                  }
                  piVar29[uVar13] = (int)fVar44;
                  uVar13 = uVar13 + 1;
                } while (uVar38 != uVar13);
              }
              break;
            case 0x15c02e:
              if (0 < (int)uVar17) {
                fVar44 = *local_158;
                fVar1 = local_158[1];
                uVar13 = 0;
                do {
                  fVar2 = (float)piVar29[uVar13];
                  fVar47 = fVar2;
                  if (fVar2 <= fVar44) {
                    fVar47 = fVar44;
                  }
                  if ((fVar2 < fVar44) || (fVar1 < fVar47)) {
                    if (fVar1 <= fVar47) {
                      fVar47 = fVar1;
                    }
                    piVar29[uVar13] = (int)fVar47;
                  }
                  uVar13 = uVar13 + 1;
                } while (uVar38 != uVar13);
              }
              break;
            case 0x15c072:
              if (0 < (int)uVar17) {
                fVar44 = *local_158;
                uVar13 = 0;
                do {
                  uVar27 = -(uint)(0.0 < (float)piVar29[uVar13]);
                  piVar29[uVar13] =
                       (int)((float)(~uVar27 & (uint)fVar44 | uVar27 & 0x3f800000) *
                            (float)piVar29[uVar13]);
                  uVar13 = uVar13 + 1;
                } while (uVar38 != uVar13);
              }
              break;
            case 0x15c0bd:
              if (0 < (int)uVar17) {
                uVar13 = 0;
                do {
                  fVar44 = expf((float)(piVar29[uVar13] ^ auVar52._0_4_));
                  auVar51 = _DAT_00163380;
                  auVar50 = _DAT_00163370;
                  auVar52 = _DAT_00162c50;
                  piVar29[uVar13] = (int)(1.0 / (fVar44 + 1.0));
                  uVar13 = uVar13 + 1;
                } while (uVar38 != uVar13);
              }
            }
          }
          piVar24 = (pointer)((long)local_178 + 1);
          piVar31 = (pointer)((long)local_f0 + (long)local_170);
          pvVar25 = (void *)((long)pvVar25 + __n * 4);
          piVar29 = (pointer)((long)piVar29 + (long)local_170);
        } while (piVar24 != local_120);
      }
    }
    else {
      uVar38 = (long)((ulong)(uint)((int)uVar27 >> 0x1f) << 0x20 | (ulong)local_120 & 0xffffffff) /
               (long)(int)uVar17;
      iVar11 = (int)uVar38;
      if (0 < (int)uVar17) {
        uVar13 = (long)this->num_output / (long)(int)uVar17;
        local_150 = (void *)(uVar13 & 0xffffffff);
        local_120 = (pointer)local_1c8._16_8_;
        local_148 = (pointer)(local_198._8_8_ * local_1c8._16_8_);
        local_e0 = local_1a8._12_4_;
        uVar35 = local_198._0_4_ * local_1a8._12_4_;
        pvVar5 = (this->weight_data).data;
        local_dc = this->bias_term;
        uVar27 = iVar14 * iVar10;
        piVar31 = (pointer)(ulong)uVar27;
        iVar10 = (int)uVar13;
        uVar13 = (ulong)(uVar35 + 3 & 0xfffffffc);
        lVar33 = (ulong)uVar35 - 1;
        auVar48._8_4_ = (int)lVar33;
        auVar48._0_8_ = lVar33;
        auVar48._12_4_ = (int)((ulong)lVar33 >> 0x20);
        lVar33 = (long)local_148 * (long)iVar10;
        local_e4 = iVar10 * iVar11 * uVar39;
        auVar48 = auVar48 ^ _DAT_00162c50;
        local_140 = (ulong)(this->activation_type - 1);
        local_a8 = (pointer)(local_1c8._0_8_ + 0xc);
        local_100 = 0;
        local_b0 = (pointer)local_1c8._0_8_;
        local_108 = 0;
        auVar50 = _DAT_00163370;
        auVar51 = _DAT_00163380;
        auVar52 = _DAT_00162c50;
        local_138 = uVar13;
        do {
          if (0 < (int)local_150) {
            local_1e8 = (void *)((long)pvVar5 + (long)(int)local_100 * 4);
            local_158 = (float *)(local_108 * (long)iVar10);
            pfVar6 = (float *)(this->activation_params).data;
            pvVar25 = (this->bias_data).data;
            iVar14 = (int)local_108;
            pvVar34 = (void *)0x0;
            piVar29 = local_b0;
            piVar24 = local_a8;
            do {
              if (local_dc == 0) {
                iVar37 = 0;
              }
              else {
                iVar37 = *(int *)((long)pvVar25 + ((long)pvVar34 + (long)local_158) * 4);
              }
              if (0 < (int)uVar35) {
                uVar20 = 0;
                do {
                  auVar46._8_4_ = (int)uVar20;
                  auVar46._0_8_ = uVar20;
                  auVar46._12_4_ = (int)(uVar20 >> 0x20);
                  auVar49 = (auVar46 | auVar51) ^ auVar52;
                  iVar18 = auVar48._4_4_;
                  if ((bool)(~(iVar18 < auVar49._4_4_ ||
                              auVar48._0_4_ < auVar49._0_4_ && auVar49._4_4_ == iVar18) & 1)) {
                    piVar24[uVar20 - 3] = iVar37;
                  }
                  if (auVar49._12_4_ <= auVar48._12_4_ &&
                      (auVar49._8_4_ <= auVar48._8_4_ || auVar49._12_4_ != auVar48._12_4_)) {
                    piVar24[uVar20 - 2] = iVar37;
                  }
                  auVar46 = (auVar46 | auVar50) ^ auVar52;
                  iVar15 = auVar46._4_4_;
                  if (iVar15 <= iVar18 && (iVar15 != iVar18 || auVar46._0_4_ <= auVar48._0_4_)) {
                    piVar24[uVar20 - 1] = iVar37;
                    piVar24[uVar20] = iVar37;
                  }
                  uVar20 = uVar20 + 4;
                } while (uVar13 != uVar20);
              }
              if (0 < (int)local_110) {
                local_f0 = (pointer)(((long)pvVar34 + (long)local_158) * (long)local_148 + uVar9);
                iVar18 = this->stride_h * local_e0;
                local_118 = CONCAT44(local_118._4_4_,iVar18);
                iVar37 = this->stride_w;
                local_178 = (pointer)0x0;
                do {
                  if (0 < (int)local_160) {
                    local_168 = (pointer)((long)(iVar18 * (int)local_178) * (long)local_120 +
                                         (long)local_f0);
                    iVar15 = local_170->w;
                    sVar19 = local_170->elemsize;
                    sVar7 = local_170->cstep;
                    pvVar8 = local_170->data;
                    lVar36 = 0;
                    do {
                      if (0 < iVar11) {
                        lVar23 = lVar36 * iVar37;
                        uVar13 = 0;
                        pvVar21 = local_1e8;
                        do {
                          if (0 < (int)uVar39) {
                            fVar44 = *(float *)((long)pvVar8 +
                                               (uVar13 + (uint)(iVar11 * iVar14)) * sVar7 * sVar19 +
                                               lVar36 * 4 + (long)iVar15 * (long)local_178 * sVar19)
                            ;
                            uVar20 = 0;
                            do {
                              lVar32 = (long)piVar3[uVar20];
                              local_168[lVar23 + lVar32] =
                                   (int)(*(float *)((long)pvVar21 + uVar20 * 4) * fVar44 +
                                        (float)local_168[lVar23 + lVar32]);
                              uVar20 = uVar20 + 1;
                            } while (uVar39 != uVar20);
                          }
                          uVar13 = uVar13 + 1;
                          pvVar21 = (void *)((long)pvVar21 + __n * 4);
                        } while (uVar13 != (uVar38 & 0xffffffff));
                      }
                      lVar36 = lVar36 + 1;
                    } while (lVar36 != local_160);
                  }
                  local_178 = (pointer)((long)local_178 + 1);
                } while (local_178 != local_110);
              }
              local_130 = piVar24;
              _remain = piVar29;
              local_f8 = pvVar34;
              if ((uint)local_140 < 4) {
                switch((long)&switchD_0015c5d7::switchdataD_00163acc +
                       (long)(int)(&switchD_0015c5d7::switchdataD_00163acc)[local_140]) {
                case 0x15c5d9:
                  if (0 < (int)uVar27) {
                    piVar24 = (pointer)0x0;
                    do {
                      fVar44 = (float)piVar29[(long)piVar24];
                      if (fVar44 <= 0.0) {
                        fVar44 = 0.0;
                      }
                      piVar29[(long)piVar24] = (int)fVar44;
                      piVar24 = (pointer)((long)piVar24 + 1);
                    } while (piVar31 != piVar24);
                  }
                  break;
                case 0x15c602:
                  if (0 < (int)uVar27) {
                    fVar44 = *pfVar6;
                    fVar1 = pfVar6[1];
                    piVar24 = (pointer)0x0;
                    do {
                      fVar2 = (float)piVar29[(long)piVar24];
                      fVar47 = fVar2;
                      if (fVar2 <= fVar44) {
                        fVar47 = fVar44;
                      }
                      if ((fVar2 < fVar44) || (fVar1 < fVar47)) {
                        if (fVar1 <= fVar47) {
                          fVar47 = fVar1;
                        }
                        piVar29[(long)piVar24] = (int)fVar47;
                      }
                      piVar24 = (pointer)((long)piVar24 + 1);
                    } while (piVar31 != piVar24);
                  }
                  break;
                case 0x15c646:
                  if (0 < (int)uVar27) {
                    piVar29 = (pointer)0x0;
                    do {
                      local_168 = piVar29;
                      fVar44 = expf((float)(_remain[(long)piVar29] ^ auVar52._0_4_));
                      auVar51 = _DAT_00163380;
                      auVar50 = _DAT_00163370;
                      auVar52 = _DAT_00162c50;
                      _remain[(long)local_168] = (int)(1.0 / (fVar44 + 1.0));
                      piVar29 = (pointer)((long)local_168 + 1);
                    } while (piVar31 != piVar29);
                  }
                  break;
                case 0x15c6d2:
                  if (0 < (int)uVar27) {
                    fVar44 = *pfVar6;
                    piVar24 = (pointer)0x0;
                    do {
                      uVar43 = -(uint)(0.0 < (float)piVar29[(long)piVar24]);
                      piVar29[(long)piVar24] =
                           (int)((float)(~uVar43 & (uint)fVar44 | uVar43 & 0x3f800000) *
                                (float)piVar29[(long)piVar24]);
                      piVar24 = (pointer)((long)piVar24 + 1);
                    } while (piVar31 != piVar24);
                  }
                }
              }
              pvVar34 = (void *)((long)local_f8 + 1);
              piVar24 = (pointer)((long)local_130 + (long)local_148);
              local_1e8 = (void *)((long)local_1e8 + (long)(int)(iVar11 * uVar39) * 4);
              piVar29 = (pointer)((long)_remain + (long)local_148);
              uVar13 = local_138;
            } while (pvVar34 != local_150);
          }
          local_108 = local_108 + 1;
          local_a8 = (pointer)((long)local_a8 + lVar33);
          local_100 = (ulong)(uint)((int)local_100 + local_e4);
          local_b0 = (pointer)((long)local_b0 + lVar33);
        } while (local_108 != uVar17);
      }
    }
    iVar11 = this->pad_w;
    iVar10 = this->pad_h;
    if (iVar10 < 1 && iVar11 < 1) {
      Mat::operator=(top_blob,(Mat *)local_1c8);
LAB_0015c822:
      iVar11 = 0;
    }
    else {
      copy_cut_border((Mat *)local_1c8,top_blob,iVar10,iVar10,iVar11,iVar11,opt->blob_allocator,
                      opt->num_threads);
      iVar11 = -100;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0))
      goto LAB_0015c822;
    }
    piVar12 = (int *)local_1c8._8_8_;
    if (_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
      piVar12 = (int *)local_1c8._8_8_;
    }
  }
  if (piVar12 == (int *)0x0) {
    return iVar11;
  }
LAB_0015c858:
  LOCK();
  *piVar12 = *piVar12 + -1;
  UNLOCK();
  if (*piVar12 == 0) {
    if ((Allocator *)local_1a8._0_8_ == (Allocator *)0x0) {
      if ((pointer)local_1c8._0_8_ != (pointer)0x0) {
        free((void *)local_1c8._0_8_);
      }
    }
    else {
      (**(code **)(*(long *)local_1a8._0_8_ + 0x18))();
    }
  }
  return iVar11;
}

Assistant:

int DeconvolutionDepthWise::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // deconvolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    if (channels % group != 0 || num_output % group != 0)
    {
        // reject invalid group
        return -100;
    }

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w;
    int outh = (h - 1) * stride_h + kernel_extent_h;

    Mat top_blob_bordered;
    if (pad_w > 0 || pad_h > 0)
    {
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.workspace_allocator);
        if (top_blob_bordered.empty())
            return -100;
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.blob_allocator);
        if (top_blob_bordered.empty())
            return -100;
    }

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = outw * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // depth-wise
    if (channels == group && group == num_output)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g=0; g<group; g++)
        {
            const float* inptr = bottom_blob.channel(g);
            const float* kptr = (const float*)weight_data + maxk * g;
            Mat m = top_blob_bordered.channel(g);

            const float bias = bias_term ? bias_data[g] : 0.f;

            m.fill(bias);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    float* outptr = m.row(i*stride_h) + j*stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = inptr[i*w + j];
                        float w = kptr[k];
                        outptr[ space_ofs[k] ] += val * w;
                    }
                }
            }


            if (activation_type == 1)
            {
                float* outptr = m;
                int size = outw * outh;

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = std::max(outptr[i], 0.f);
                }
            }
            else if (activation_type == 2)
            {
                float* outptr = m;
                int size = outw * outh;
                float slope = activation_params[0];

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = outptr[i] > 0.f ? outptr[i] : outptr[i] * slope;
                }
            }
            else if (activation_type == 3)
            {
                float* outptr = m;
                int size = outw * outh;
                float min = activation_params[0];
                float max = activation_params[1];

                for (int i = 0; i < size; i++)
                {
                    if (outptr[i] < min)
                        outptr[i] = min;
                    if (outptr[i] > max)
                        outptr[i] = max;
                }
            }
            else if (activation_type == 4)
            {
                float* outptr = m;
                int size = outw * outh;

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = 1.f / (1.f + exp(-outptr[i]));
                }
            }
        }
    }
    else
    {
        // num_output
        const int channels_g = channels / group;
        const int num_output_g = num_output / group;

#ifdef _WIN32
        #pragma omp parallel for num_threads(opt.num_threads)
#else // _WIN32
        #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif // _WIN32
        for (int g = 0; g < group; g++)
        {
            for (int p = 0; p < num_output_g; p++)
            {
                Mat out = top_blob_bordered.channel(g * num_output_g + p);

                const float* weight_data_ptr = (const float*)weight_data + maxk * channels_g * num_output_g * g;
                const float bias = bias_term ? bias_data[g * num_output_g + p] : 0.f;

                out.fill(bias);

                for (int i = 0; i < h; i++)
                {
                    for (int j = 0; j < w; j++)
                    {
                        float* outptr = out.row(i*stride_h) + j*stride_w;

                        const float* kptr = weight_data_ptr + maxk * channels_g * p;

                        // channels_g
                        for (int q = 0; q < channels_g; q++)
                        {
                            const Mat m = bottom_blob.channel(channels_g * g + q);
                            float val = *(m.row(i) + j);

                            for (int k = 0; k < maxk; k++)
                            {
                                outptr[ space_ofs[k] ] += val * kptr[k];
                            }

                            kptr += maxk;
                        }
                    }
                }

                if (activation_type == 1)
                {
                    float* outptr = out;
                    int size = outw * outh;

                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] = std::max(outptr[i], 0.f);
                    }
                }
                else if (activation_type == 2)
                {
                    float* outptr = out;
                    int size = outw * outh;
                    float slope = activation_params[0];

                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] = outptr[i] > 0.f ? outptr[i] : outptr[i] * slope;
                    }
                }
                else if (activation_type == 3)
                {
                    float* outptr = out;
                    int size = outw * outh;
                    float min = activation_params[0];
                    float max = activation_params[1];

                    for (int i = 0; i < size; i++)
                    {
                        if (outptr[i] < min)
                            outptr[i] = min;
                        if (outptr[i] > max)
                            outptr[i] = max;
                    }
                }
                else if (activation_type == 4)
                {
                    float* outptr = out;
                    int size = outw * outh;

                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] = 1.f / (1.f + exp(-outptr[i]));
                    }
                }
            }
        }
    }

    if (pad_w > 0 || pad_h > 0)
    {
        copy_cut_border(top_blob_bordered, top_blob, pad_h, pad_h, pad_w, pad_w, opt.blob_allocator, opt.num_threads);
        if (top_blob.empty())
            return -100;

        outw = top_blob.w;
        outh = top_blob.h;
    }
    else
    {
        top_blob = top_blob_bordered;
    }

    return 0;
}